

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockBuildSystemDelegate.h
# Opt level: O1

void __thiscall
llbuild::unittests::MockBuildSystemDelegate::commandHadNote
          (MockBuildSystemDelegate *this,Command *command,StringRef data)

{
  Child CVar1;
  Child CVar2;
  NodeKind LHSKind;
  Child CVar3;
  Child CVar4;
  unique_lock<std::mutex> lock;
  Child local_e8 [2];
  undefined2 local_d8;
  undefined6 uStack_d6;
  Twine local_c8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  NodeKind local_a0;
  char cStack_9f;
  undefined6 uStack_9e;
  uint local_98;
  undefined4 uStack_94;
  NodeKind local_88;
  char cStack_87;
  undefined6 uStack_86;
  uint local_80;
  undefined4 uStack_7c;
  NodeKind local_70;
  char cStack_6f;
  undefined6 uStack_6e;
  unique_lock<std::mutex> local_68;
  StringRef local_58;
  string local_48;
  StringRef local_28;
  
  local_58.Length = data.Length;
  local_58.Data = data.Data;
  if (this->trackAllMessages == true) {
    local_68._M_device = &this->messagesMutex;
    local_68._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_68);
    local_68._M_owns = true;
    local_28.Data = (command->name)._M_dataplus._M_p;
    local_28.Length = (command->name)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_80,"commandNote(",&local_28);
    llvm::Twine::Twine((Twine *)&local_98,") ");
    if ((local_70 == NullKind) || (local_88 == NullKind)) {
      local_d8 = 0x100;
    }
    else if (local_70 == EmptyKind) {
      local_d8._1_1_ = cStack_87;
      local_d8._0_1_ = local_88;
      uStack_d6 = uStack_86;
      local_e8[0]._0_4_ = local_98;
      local_e8[0]._4_4_ = uStack_94;
    }
    else if (local_88 == EmptyKind) {
      local_d8._1_1_ = cStack_6f;
      local_d8._0_1_ = local_70;
      uStack_d6 = uStack_6e;
      local_e8[0]._0_4_ = local_80;
      local_e8[0]._4_4_ = uStack_7c;
    }
    else {
      CVar3._4_4_ = uStack_7c;
      CVar3.decUI = local_80;
      if (cStack_6f != '\x01') {
        local_70 = TwineKind;
        CVar3.twine = (Twine *)&local_80;
      }
      if (cStack_87 != '\x01') {
        local_88 = TwineKind;
      }
      CVar2._4_4_ = uStack_94;
      CVar2.decUI = local_98;
      CVar4.twine = (Twine *)&local_98;
      if (cStack_87 == '\x01') {
        CVar4 = CVar2;
      }
      llvm::Twine::Twine((Twine *)local_e8,CVar3,local_70,CVar4,local_88);
    }
    llvm::Twine::Twine((Twine *)&local_b0,&local_58);
    if (((NodeKind)local_d8 == NullKind) || (local_a0 == NullKind)) {
      local_c8._16_2_ = 0x100;
    }
    else if ((NodeKind)local_d8 == EmptyKind) {
      local_c8.RHSKind = cStack_9f;
      local_c8.LHSKind = local_a0;
      local_c8._18_6_ = uStack_9e;
    }
    else if (local_a0 == EmptyKind) {
      local_c8.LHSKind = (NodeKind)local_d8;
      local_c8.RHSKind = local_d8._1_1_;
      local_c8._18_6_ = uStack_d6;
    }
    else {
      CVar4._4_4_ = local_e8[0]._4_4_;
      CVar4.decUI = local_e8[0].decUI;
      LHSKind = (NodeKind)local_d8;
      if (local_d8._1_1_ != EmptyKind) {
        CVar4.twine = (Twine *)local_e8;
        LHSKind = TwineKind;
      }
      if (cStack_9f != '\x01') {
        local_a0 = TwineKind;
      }
      CVar1._4_4_ = uStack_ac;
      CVar1.decUI = local_b0;
      CVar3.twine = (Twine *)&local_b0;
      if (cStack_9f == '\x01') {
        CVar3 = CVar1;
      }
      llvm::Twine::Twine(&local_c8,CVar4,LHSKind,CVar3,local_a0);
    }
    llvm::Twine::str_abi_cxx11_(&local_48,&local_c8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->messages,
               &local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_68._M_owns == true) {
      std::unique_lock<std::mutex>::unlock(&local_68);
    }
  }
  return;
}

Assistant:

virtual void commandHadNote(Command* command, StringRef data) {
    if (trackAllMessages) {
      std::unique_lock<std::mutex> lock(messagesMutex);
      messages.push_back(("commandNote(" + command->getName() + ") " + data).str());
    }
  }